

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

void __thiscall
Js::ScriptContextPolymorphicInlineCache::PrintStats
          (ScriptContextPolymorphicInlineCache *this,InlineCacheData *data)

{
  char16_t *pcVar1;
  float fVar2;
  
  pcVar1 = L"set";
  fVar2 = (float)(data->hits + data->misses);
  if (data->isGetCache != false) {
    pcVar1 = L"get";
  }
  Output::Print(L"ScriptContext,%s,%s,%d,%d,%f,%d,%f,%d\n",(double)((float)data->misses / fVar2),
                (double)((float)data->collisions / fVar2),pcVar1);
  return;
}

Assistant:

void ScriptContextPolymorphicInlineCache::PrintStats(InlineCacheData *data) const
    {
        uint total = data->hits + data->misses;

        Output::Print(_u("ScriptContext,%s,%s,%d,%d,%f,%d,%f,%d\n"),
            data->isGetCache ? _u("get") : _u("set"),
            total,
            data->misses,
            static_cast<float>(data->misses) / total,
            data->collisions,
            static_cast<float>(data->collisions) / total,
            GetSize()
        );
    }